

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O2

void Dump(OutputStream *stream,SQFuncState *fState)

{
  SQInteger x;
  char *pcVar1;
  SQInt32 _nliterals;
  SQObject *pSVar2;
  SQObjectPtr refidx;
  SQObjectPtrVec literals;
  SQObjectPtr val;
  SQObjectPtr key;
  SQObject local_88;
  sqvector<SQObjectPtr,_unsigned_int> local_70;
  SQObject local_58;
  SQObject local_48;
  
  if ((fState->_name).super_SQObject._type == OT_STRING) {
    pcVar1 = (char *)&((fState->_name).super_SQObject._unVal.pTable)->_firstfree;
  }
  else {
    pcVar1 = "unknown";
  }
  streamprintf(stream,"*****FUNCTION [%s]\n",pcVar1);
  local_70._alloc_ctx = fState->_sharedstate->_alloc_ctx;
  local_70._vals = (SQObjectPtr *)0x0;
  local_70._size = 0;
  local_70._allocated = 0;
  local_88._unVal.pTable = (SQTable *)0x0;
  local_88._type = OT_NULL;
  local_88._flags = '\0';
  local_88._5_3_ = 0;
  sqvector<SQObjectPtr,_unsigned_int>::resize
            (&local_70,((fState->_literals).super_SQObject._unVal.pTable)->_usednodes,
             (SQObjectPtr *)&local_88);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_88);
  local_88._unVal.pTable = (SQTable *)0x0;
  local_88._type = OT_NULL;
  local_88._flags = '\0';
  local_88._5_3_ = 0;
  local_48._unVal.pTable = (SQTable *)0x0;
  local_48._type = OT_NULL;
  local_48._flags = '\0';
  local_48._5_3_ = 0;
  local_58._unVal.pTable = (SQTable *)0x0;
  local_58._type = OT_NULL;
  local_58._flags = '\0';
  local_58._5_3_ = 0;
  while( true ) {
    pSVar2 = &local_58;
    x = SQTable::Next((fState->_literals).super_SQObject._unVal.pTable,false,
                      (SQObjectPtr *)&local_88,(SQObjectPtr *)&local_48,(SQObjectPtr *)&local_58);
    _nliterals = (SQInt32)pSVar2;
    if (x == -1) break;
    SQObjectPtr::operator=
              (local_70._vals + (local_58._unVal.nInteger & 0xffffffff),(SQObjectPtr *)&local_48);
    SQObjectPtr::operator=((SQObjectPtr *)&local_88,x);
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_58);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_48);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_88);
  DumpLiterals(stream,local_70._vals,local_70._size);
  DumpLocals(stream,(fState->_localvarinfos)._vals,(fState->_localvarinfos)._size);
  DumpLineInfo(stream,(fState->_lineinfos)._vals,(fState->_lineinfos)._size);
  streamprintf(stream,"-----dump\n");
  DumpInstructions(stream,(fState->_instructions)._vals,(fState->_instructions)._size,local_70._vals
                   ,_nliterals);
  sqvector<SQObjectPtr,_unsigned_int>::~sqvector(&local_70);
  return;
}

Assistant:

void Dump(OutputStream *stream, const SQFuncState *fState)
{
    streamprintf(stream, _SC("*****FUNCTION [%s]\n"), sq_type(fState->_name) == OT_STRING ? _stringval(fState->_name) : _SC("unknown"));
    SQObjectPtrVec literals(fState->_sharedstate->_alloc_ctx);
    literals.resize(_table(fState->_literals)->CountUsed());
    {
        SQObjectPtr refidx,key,val;
        SQInteger idx;
        while((idx=_table(fState->_literals)->Next(false,refidx,key,val))!=-1) {
            literals[_integer(val)]=key;
            refidx=idx;
        }
    }
    DumpLiterals(stream, literals.begin(), literals.size());
    DumpLocals(stream, fState->_localvarinfos.begin(), fState->_localvarinfos.size());
    DumpLineInfo(stream, fState->_lineinfos.begin(), fState->_lineinfos.size());
    streamprintf(stream, _SC("-----dump\n"));
    DumpInstructions(stream, fState->_instructions.begin(), fState->_instructions.size(), literals.begin(), literals.size());
}